

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.h
# Opt level: O2

int __thiscall cppcms::session_interface::get<int>(session_interface *this,string *key)

{
  bad_cast *this_00;
  locale alStack_1b8 [8];
  int value;
  istringstream ss;
  uint auStack_170 [88];
  
  get((string *)&value,this,key);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&value,_S_in);
  std::__cxx11::string::~string((string *)&value);
  std::locale::classic();
  std::ios::imbue(alStack_1b8);
  std::locale::~locale(alStack_1b8);
  std::istream::operator>>(&ss,&value);
  if ((*(uint *)((long)auStack_170 + *(long *)(_ss + -0x18)) & 7) == 2) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    return value;
  }
  this_00 = (bad_cast *)__cxa_allocate_exception(0x28);
  *(undefined8 *)this_00 = 0;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)0x0;
  (this_00->super_backtrace).frames_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_backtrace).frames_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_backtrace).frames_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  booster::bad_cast::bad_cast(this_00);
  __cxa_throw(this_00,&booster::bad_cast::typeinfo,booster::bad_cast::~bad_cast);
}

Assistant:

T get(std::string const &key)
	{
		std::istringstream ss(get(key));
		ss.imbue(std::locale::classic());
		T value;
		ss>>value;
		if(ss.fail() || !ss.eof())
			throw booster::bad_cast();
		return value;
	}